

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deprecation-warning.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *in_RSI;
  int in_EDI;
  string replacement_filename;
  size_t pos;
  string filename;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  FILE *pFVar4;
  string local_90 [16];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::~allocator(&local_31);
  if (0 < local_8) {
    std::__cxx11::string::operator=(local_30,(char *)*local_10);
  }
  lVar2 = std::__cxx11::string::find_last_of((char *)local_30,0x103009);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff90,(ulong)local_30);
    std::__cxx11::string::operator=(local_30,(string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (bVar1) {
    std::__cxx11::string::operator=(local_90,"whisper-cli");
  }
  bVar1 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (bVar1) {
    std::__cxx11::string::operator=(local_90,"whisper-cli.exe");
  }
  fprintf(_stdout,"\n");
  pFVar4 = _stdout;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar4,"WARNING: The binary \'%s\' is deprecated.\n",uVar3);
  pFVar4 = _stdout;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar4," Please use \'%s\' instead.\n",uVar3);
  fprintf(_stdout,
          " See https://github.com/ggerganov/whisper.cpp/tree/master/examples/deprecation-warning/README.md for more information.\n"
         );
  fprintf(_stdout,"\n");
  local_4 = 1;
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    std::string filename = "main";
    if (argc >= 1) {
        filename = argv[0];
    }

    // Get only the program name from the full path
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
        filename = filename.substr(pos+1);
    }

    // Append "whisper-" to the beginning of filename to get the replacemnt filename
    std::string replacement_filename = "whisper-" + filename;

    // The exception is if the filename is "main", then our replacement filename is "whisper-cli"
    if (filename == "main") {
        replacement_filename = "whisper-cli";
    }

    if (filename == "main.exe") {
        replacement_filename = "whisper-cli.exe";
    }

    fprintf(stdout, "\n");
    fprintf(stdout, "WARNING: The binary '%s' is deprecated.\n", filename.c_str());
    fprintf(stdout, " Please use '%s' instead.\n", replacement_filename.c_str());
    fprintf(stdout, " See https://github.com/ggerganov/whisper.cpp/tree/master/examples/deprecation-warning/README.md for more information.\n");
    fprintf(stdout, "\n");

    return EXIT_FAILURE;
}